

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall Js::CompoundString::AppendSlow(CompoundString *this,char16 c)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  JavascriptString *s;
  undefined4 *puVar3;
  bool local_21;
  bool appended;
  char16 c_local;
  CompoundString *this_local;
  
  Grow(this);
  bVar2 = HasOnlyDirectChars(this);
  if (bVar2) {
    local_21 = TryAppendGeneric<Js::CompoundString>(c,this);
  }
  else {
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_01 = JavascriptLibrary::GetCharStringCache(this_00);
    s = CharStringCache::GetStringForChar(this_01,c);
    local_21 = TryAppendGeneric<Js::CompoundString>(s,1,this);
  }
  if (local_21 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x326,"(appended)","appended");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void CompoundString::AppendSlow(const char16 c)
    {
        Grow();
        const bool appended =
            HasOnlyDirectChars()
                ? TryAppendGeneric(c, this)
                : TryAppendGeneric(GetLibrary()->GetCharStringCache().GetStringForChar(c), 1, this);
        Assert(appended);
    }